

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O2

shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::getCompiledProgram
          (GLEngine *this,string *programName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *customRules,ShaderReplacementDefaults defaults)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  size_type *this_01;
  DrawMode dm;
  value_type *pvVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  mapped_type *stages;
  mapped_type *pmVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  iterator iVar7;
  mapped_type *__x;
  GLCompiledProgram *this_02;
  __shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  *p_Var8;
  long lVar9;
  undefined4 in_register_0000000c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *rule;
  value_type *__x_00;
  ShaderReplacementDefaults in_R8D;
  pointer __lhs;
  shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram> sVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fullCustomRules;
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  updatedStages;
  __shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  local_d8;
  string progKey;
  vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
  rules;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  programKeyFromRules(&progKey,(GLEngine *)programName,(string *)customRules,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_register_0000000c,defaults),in_R8D);
  this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(programName[0x1a].field_2._M_local_buf + 8);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(this_00,&progKey);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    if (3 < options::verbosity) {
      std::operator+(&local_70,"compiling shader program ",&progKey);
      info(&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    this_01 = &programName[0x17]._M_string_length;
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)this_01,(key_type *)customRules);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &updatedStages,"No shader program with name [",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     customRules);
      std::operator+(&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &updatedStages,"] registered.");
      exception(&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&updatedStages);
    }
    stages = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)customRules);
    pmVar5 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,(key_type *)customRules);
    dm = pmVar5->second;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&fullCustomRules,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_register_0000000c,defaults));
    switch(in_R8D) {
    case SceneObject:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fullCustomRules,
                 (const_iterator)
                 fullCustomRules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&programName[0x14].field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 programName[0x15]._M_dataplus._M_p);
      break;
    case SceneObjectNoSlice:
      pvVar1 = (value_type *)programName[0x15]._M_dataplus._M_p;
      for (__x_00 = *(value_type **)((long)&programName[0x14].field_2 + 8); __x_00 != pvVar1;
          __x_00 = __x_00 + 1) {
        lVar9 = std::__cxx11::string::rfind((char *)__x_00,0x4b2368);
        if (lVar9 != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&fullCustomRules,
                   (const_iterator)
                   fullCustomRules.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,__x_00);
        }
      }
      break;
    case Pick:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fullCustomRules,
                 (const_iterator)
                 fullCustomRules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 programName[0x15].field_2._M_allocated_capacity,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&programName[0x15].field_2 + 8));
      break;
    case Process:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fullCustomRules,
                 (const_iterator)
                 fullCustomRules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 programName[0x16]._M_string_length,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 programName[0x16].field_2._M_allocated_capacity);
    }
    rules.
    super__Vector_base<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rules.
    super__Vector_base<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rules.
    super__Vector_base<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (__lhs = fullCustomRules.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs < fullCustomRules.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      bVar2 = std::operator==(__lhs,"");
      if ((!bVar2) &&
         (_Var6 = std::
                  __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                            (fullCustomRules.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,__lhs,__lhs),
         __lhs == _Var6._M_current)) {
        iVar7 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(programName + 0x19),__lhs);
        if (iVar7.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &updatedStages,"No shader replacement rule with name [",__lhs);
          std::operator+(&local_50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &updatedStages,"] registered.");
          exception(&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&updatedStages);
        }
        __x = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)(programName + 0x19),__lhs);
        std::
        vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
        ::push_back(&rules,__x);
      }
    }
    applyShaderReplacements(&updatedStages,&stages->first,&rules);
    this_02 = (GLCompiledProgram *)operator_new(0x50);
    GLCompiledProgram::GLCompiledProgram(this_02,&updatedStages,dm);
    std::
    __shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,void>
              ((__shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,(__gnu_cxx::_Lock_policy)2>
                *)&local_d8,this_02);
    p_Var8 = &std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_00,&progKey)->
              super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::
    __shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
    ::operator=(p_Var8,&local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
    std::
    vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
    ::~vector(&updatedStages);
    std::
    vector<polyscope::render::ShaderReplacementRule,_std::allocator<polyscope::render::ShaderReplacementRule>_>
    ::~vector(&rules);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&fullCustomRules);
  }
  p_Var8 = &std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_00,&progKey)->
            super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ;
  std::
  __shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
                  *)this,p_Var8);
  std::__cxx11::string::~string((string *)&progKey);
  sVar10.
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar10.
  super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram>)
         sVar10.
         super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<GLCompiledProgram> GLEngine::getCompiledProgram(const std::string& programName,
                                                                const std::vector<std::string>& customRules,
                                                                ShaderReplacementDefaults defaults) {

  // Build a cache key for the program
  std::string progKey = programKeyFromRules(programName, customRules, defaults);


  // If the cache doesn't already contain the program, create it and add to cache
  if (compiledProgamCache.find(progKey) == compiledProgamCache.end()) {

    if (polyscope::options::verbosity > 3) polyscope::info("compiling shader program " + progKey);

    // == Compile the program

    // Get the list of shaders comprising the program from the global cache
    if (registeredShaderPrograms.find(programName) == registeredShaderPrograms.end()) {
      exception("No shader program with name [" + programName + "] registered.");
    }
    const std::vector<ShaderStageSpecification>& stages = registeredShaderPrograms[programName].first;
    DrawMode dm = registeredShaderPrograms[programName].second;

    // Add in the default rules
    std::vector<std::string> fullCustomRules = customRules;
    switch (defaults) {
    case ShaderReplacementDefaults::SceneObject: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_sceneObject.begin(), defaultRules_sceneObject.end());
      break;
    }
    case ShaderReplacementDefaults::SceneObjectNoSlice: {
      for (const std::string& rule : defaultRules_sceneObject) {
        if (rule.rfind("SLICE_PLANE_", 0) != 0) {
          fullCustomRules.insert(fullCustomRules.end(), rule);
        }
      }
      break;
    }
    case ShaderReplacementDefaults::Pick: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_pick.begin(), defaultRules_pick.end());
      break;
    }
    case ShaderReplacementDefaults::Process: {
      fullCustomRules.insert(fullCustomRules.end(), defaultRules_process.begin(), defaultRules_process.end());
      break;
    }
    case ShaderReplacementDefaults::None: {
      break;
    }
    }

    // Prepare rule substitutions
    std::vector<ShaderReplacementRule> rules;
    for (auto it = fullCustomRules.begin(); it < fullCustomRules.end(); it++) {
      std::string& ruleName = *it;

      // Empty rule is a no-op
      if (ruleName == "") {
        continue;
      }

      // Only process each rule the first time it is seen
      if (std::find(fullCustomRules.begin(), it, ruleName) != it) {
        continue;
      }

      if (registeredShaderRules.find(ruleName) == registeredShaderRules.end()) {
        exception("No shader replacement rule with name [" + ruleName + "] registered.");
      }
      ShaderReplacementRule& thisRule = registeredShaderRules[ruleName];
      rules.push_back(thisRule);
    }

    // Actually apply rule substitutions
    std::vector<ShaderStageSpecification> updatedStages = applyShaderReplacements(stages, rules);

    // Create a new compiled program (GL work happens in the constructor)
    compiledProgamCache[progKey] = std::shared_ptr<GLCompiledProgram>(new GLCompiledProgram(updatedStages, dm));
  }

  // Now that the cache must contain the compiled program, just return it
  return compiledProgamCache[progKey];
}